

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall helics::InvalidIdentifier::~InvalidIdentifier(InvalidIdentifier *this)

{
  void *in_RDI;
  
  ~InvalidIdentifier((InvalidIdentifier *)0x2a98c8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit InvalidIdentifier(std::string_view message = "invalid identifier") noexcept:
        HelicsException(message)
    {
    }